

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int lookup_certificate(ptls_lookup_certificate_t *_self,ptls_t *tls,uint16_t *sign_algorithm,
                      _func_int_void_ptr_ptls_buffer_t_ptr_ptls_iovec_t **signer,void **signer_data,
                      ptls_iovec_t **certs,size_t *num_certs,char *server_name,
                      uint16_t *signature_algorithms,size_t num_signature_algorithms)

{
  long lVar1;
  uint16_t uVar2;
  int iVar3;
  size_t sVar4;
  
  if (_self[2].cb !=
      (_func_int_st_ptls_lookup_certificate_t_ptr_ptls_t_ptr_uint16_t_ptr__func_int_void_ptr_ptls_buffer_t_ptr_ptls_iovec_t_ptr_ptr_void_ptr_ptr_ptls_iovec_t_ptr_ptr_size_t_ptr_char_ptr_uint16_t_ptr_size_t
       *)0x0) {
    lVar1 = *(long *)_self[1].cb;
    iVar3 = EVP_PKEY_get_id(*(undefined8 *)(lVar1 + 0x10));
    if (iVar3 == 6) {
      if (num_signature_algorithms != 0) {
        sVar4 = 0;
        do {
          if (signature_algorithms[sVar4] == 0x804) {
            uVar2 = 0x804;
            goto LAB_001047bc;
          }
          sVar4 = sVar4 + 1;
        } while (num_signature_algorithms != sVar4);
      }
    }
    else {
      if (iVar3 != 0x198) {
        __assert_fail("!\"logic flaw\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/lib/openssl.c"
                      ,0x231,
                      "uint16_t select_compatible_signature_algorithm(EVP_PKEY *, const uint16_t *, size_t)"
                     );
      }
      if (num_signature_algorithms != 0) {
        sVar4 = 0;
        do {
          if (signature_algorithms[sVar4] == 0x403) {
            uVar2 = 0x403;
LAB_001047bc:
            *sign_algorithm = uVar2;
            *signer = rsapss_sign;
            *signer_data = *(void **)(lVar1 + 0x10);
            *certs = (ptls_iovec_t *)(lVar1 + 0x20);
            *num_certs = *(size_t *)(lVar1 + 0x18);
            return 0;
          }
          sVar4 = sVar4 + 1;
        } while (num_signature_algorithms != sVar4);
      }
    }
    *sign_algorithm = 0xffff;
  }
  return 0x28;
}

Assistant:

static int lookup_certificate(ptls_lookup_certificate_t *_self, ptls_t *tls, uint16_t *sign_algorithm,
                              int (**signer)(void *sign_ctx, ptls_buffer_t *outbuf, ptls_iovec_t input), void **signer_data,
                              ptls_iovec_t **certs, size_t *num_certs, const char *server_name,
                              const uint16_t *signature_algorithms, size_t num_signature_algorithms)
{
    ptls_openssl_lookup_certificate_t *self = (ptls_openssl_lookup_certificate_t *)_self;
    struct st_ptls_openssl_identity_t *identity;

    if (self->count == 0)
        return PTLS_ALERT_HANDSHAKE_FAILURE;

    if (server_name != NULL) {
        size_t i, server_name_len = strlen(server_name);
        for (i = 0; i != self->count; ++i) {
            identity = self->identities[i];
            if (ascii_streq_caseless(ptls_iovec_init(server_name, server_name_len), identity->name) &&
                (*sign_algorithm = select_compatible_signature_algorithm(identity->key, signature_algorithms,
                                                                         num_signature_algorithms)) != UINT16_MAX)
                goto Found;
        }
    }
    /* not found, use the first one, if the signing algorithm matches */
    identity = self->identities[0];
    if ((*sign_algorithm = select_compatible_signature_algorithm(identity->key, signature_algorithms, num_signature_algorithms)) ==
        UINT16_MAX)
        return PTLS_ALERT_HANDSHAKE_FAILURE;

Found:
    /* setup the rest */
    *signer = rsapss_sign;
    *signer_data = identity->key;
    *certs = identity->certs;
    *num_certs = identity->num_certs;

    return 0;
}